

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1482a::TestCheckEqualWithUnsignedLong::RunImpl
          (TestCheckEqualWithUnsignedLong *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  unsigned_long something;
  TestResults results;
  unsigned_long local_48;
  TestDetails local_40;
  TestResults local_20;
  
  UnitTest::TestResults::TestResults(&local_20,(TestReporter *)0x0);
  local_48 = 2;
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar2,0xe);
  UnitTest::CheckEqual<unsigned_long,unsigned_long>(results_00,&local_48,&local_48,&local_40);
  return;
}

Assistant:

TEST(CheckEqualWithUnsignedLong)
{
    TestResults results;
    unsigned long something = 2;
    CHECK_EQUAL(something, something);
}